

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O1

float parseReal(char *str,int start,int len)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ushort **ppuVar5;
  int iVar6;
  char *pcVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  
  fVar8 = 0.0;
  if ((0 < len && -1 < start) && str != (char *)0x0) {
    pcVar7 = str + (uint)start;
    iVar6 = len + 1;
    dVar9 = 0.0;
    dVar10 = 1.0;
    bVar2 = false;
    bVar3 = false;
    while( true ) {
      cVar1 = *pcVar7;
      if ((long)cVar1 == 0) break;
      if ((byte)(cVar1 - 0x30U) < 10) {
        if (bVar2) {
          dVar10 = dVar10 * 0.1;
        }
        dVar9 = dVar9 * 10.0 + (double)(byte)(cVar1 - 0x30);
        bVar4 = true;
      }
      else {
        bVar4 = true;
        if (bVar3 || cVar1 != '+') {
          if (cVar1 == '-' && !bVar3) {
            dVar10 = -1.0;
          }
          else if (bVar2 || cVar1 != '.') {
            ppuVar5 = __ctype_b_loc();
            if (((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) ||
               (bVar4 = false, bVar3)) break;
          }
          else {
            bVar2 = true;
            bVar4 = bVar3;
          }
        }
      }
      bVar3 = bVar4;
      pcVar7 = pcVar7 + 1;
      iVar6 = iVar6 + -1;
      if (iVar6 < 2) break;
    }
    fVar8 = (float)(dVar9 * dVar10);
  }
  return fVar8;
}

Assistant:

float parseReal(char *str, int start, int len) {
   double value = 0.0, scale = 1.0;
   register char ch;
   int inside = 0, infract = 0;

   if (!str || start < 0) { return 0; }
   str += start;

   while((len-- > 0) && *str) {
      ch = *str++;
      if ((ch >='0') && (ch <= '9')) {
	 value = (10.0*value) + (ch - '0');
	 if (infract) { scale *= 0.1; }
	 inside = 1;
      }
      else if (ch == '+' && !inside) {
	 inside = 1;
      }
      else if (ch == '-' && !inside) {
	 scale = -1.0;
	 inside = 1;
      }
      else if (ch == '.' && !infract) {
	 infract = 1;
      }
      else if (isspace(ch) && !inside) { /* nothing */ }
      else break; /* end of real */
   }
   return value*scale;
}